

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

int lua_setmetatable(lua_State *L,int idx)

{
  uint uVar1;
  int iVar2;
  GCobj *o;
  TValue *pTVar3;
  ulong uVar4;
  ulong uVar5;
  undefined4 uVar6;
  GCobj *v;
  
  pTVar3 = index2adr(L,idx);
  if (*(int *)((long)L->top + -4) == -1) {
    v = (GCobj *)0x0;
  }
  else {
    v = (GCobj *)(ulong)L->top[-1].u32.lo;
  }
  uVar6 = SUB84(v,0);
  if ((pTVar3->field_2).it == 0xfffffff3) {
    *(undefined4 *)((ulong)(pTVar3->u32).lo + 0x10) = uVar6;
    if (((v != (GCobj *)0x0) && (((v->gch).marked & 3) != 0)) &&
       (((((GCobj *)(ulong)(pTVar3->u32).lo)->gch).marked & 4) != 0)) {
      lj_gc_barrierf((global_State *)(ulong)(L->glref).ptr32,(GCobj *)(ulong)(pTVar3->u32).lo,v);
    }
  }
  else if ((pTVar3->field_2).it == 0xfffffff4) {
    *(undefined4 *)((ulong)(pTVar3->u32).lo + 0x10) = uVar6;
    if ((v != (GCobj *)0x0) && (((v->gch).marked & 3) != 0)) {
      uVar1 = (pTVar3->u32).lo;
      uVar4 = (ulong)uVar1;
      if ((*(byte *)(uVar4 + 4) & 4) != 0) {
        uVar5 = (ulong)(L->glref).ptr32;
        *(byte *)(uVar4 + 4) = *(byte *)(uVar4 + 4) & 0xfb;
        *(undefined4 *)(uVar4 + 0xc) = *(undefined4 *)(uVar5 + 0x6c);
        *(uint *)(uVar5 + 0x6c) = uVar1;
      }
    }
  }
  else {
    uVar4 = (ulong)(L->glref).ptr32;
    iVar2 = lj_trace_flushall(L);
    if (iVar2 != 0) {
      lj_err_caller(L,LJ_ERR_NOGCMM);
    }
    pTVar3 = index2adr(L,idx);
    uVar1 = (pTVar3->field_2).it;
    if (uVar1 + 3 < 2) {
      *(undefined4 *)(uVar4 + 0x1f8) = uVar6;
      *(undefined4 *)(uVar4 + 500) = uVar6;
    }
    else {
      uVar5 = 0x23;
      if ((0xfffeffff < uVar1) && (uVar5 = 0x19, (uVar1 & 0xffff8000) != 0xffff0000)) {
        uVar5 = (ulong)(0x15 - uVar1);
      }
      *(undefined4 *)(uVar4 + 0x198 + uVar5 * 4) = uVar6;
    }
  }
  L->top = L->top + -1;
  return 1;
}

Assistant:

LUA_API int lua_setmetatable(lua_State *L, int idx)
{
  global_State *g;
  GCtab *mt;
  cTValue *o = index2adr_check(L, idx);
  lj_checkapi_slot(1);
  if (tvisnil(L->top-1)) {
    mt = NULL;
  } else {
    lj_checkapi(tvistab(L->top-1), "top stack slot is not a table");
    mt = tabV(L->top-1);
  }
  g = G(L);
  if (tvistab(o)) {
    setgcref(tabV(o)->metatable, obj2gco(mt));
    if (mt)
      lj_gc_objbarriert(L, tabV(o), mt);
  } else if (tvisudata(o)) {
    setgcref(udataV(o)->metatable, obj2gco(mt));
    if (mt)
      lj_gc_objbarrier(L, udataV(o), mt);
  } else {
    /* Flush cache, since traces specialize to basemt. But not during __gc. */
    if (lj_trace_flushall(L))
      lj_err_caller(L, LJ_ERR_NOGCMM);
    o = index2adr(L, idx);  /* Stack may have been reallocated. */
    if (tvisbool(o)) {
      /* NOBARRIER: basemt is a GC root. */
      setgcref(basemt_it(g, LJ_TTRUE), obj2gco(mt));
      setgcref(basemt_it(g, LJ_TFALSE), obj2gco(mt));
    } else {
      /* NOBARRIER: basemt is a GC root. */
      setgcref(basemt_obj(g, o), obj2gco(mt));
    }
  }
  L->top--;
  return 1;
}